

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O2

JSValue js_array_flatten(JSContext *ctx,JSValue this_val,int argc,JSValue *argv,int map)

{
  JSValue mapperFunction;
  JSValue thisArg;
  int iVar1;
  int64_t iVar2;
  ulong uVar3;
  JSValue JVar4;
  JSValue JVar5;
  int depthNum;
  int32_t local_58;
  undefined4 uStack_54;
  int64_t iStack_50;
  JSValueUnion local_48;
  int64_t iStack_40;
  int64_t sourceLen;
  
  JVar4 = JS_ToObject(ctx,this_val);
  iVar1 = js_get_length64(ctx,&sourceLen,JVar4);
  if (iVar1 == 0) {
    local_58 = 0;
    depthNum = 1;
    local_48.float64 = local_48.float64 & 0xffffffff00000000;
    iStack_50 = 3;
    iStack_40 = 3;
    if (map == 0) {
      if (((argc < 1) || ((int)argv->tag == 3)) ||
         (JVar5.tag = argv->tag, JVar5.u.ptr = (argv->u).ptr,
         iVar1 = JS_ToInt32Sat(ctx,&depthNum,JVar5), -1 < iVar1)) goto LAB_00155aa0;
    }
    else {
      iStack_50 = argv->tag;
      local_58 = (argv->u).int32;
      uStack_54 = SUB84(argv->u,4);
      if (1 < argc) {
        local_48 = (JSValueUnion)argv[1].u.ptr;
        iStack_40 = argv[1].tag;
      }
      iVar1 = check_function(ctx,*argv);
      if (iVar1 == 0) {
LAB_00155aa0:
        JVar5 = JS_ArraySpeciesCreate(ctx,JVar4,(JSValue)ZEXT816(0));
        uVar3 = (ulong)JVar5.u.ptr >> 0x20;
        if (((int)JVar5.tag != 6) &&
           (mapperFunction.u._4_4_ = uStack_54, mapperFunction.u.int32 = local_58,
           mapperFunction.tag = iStack_50, thisArg.tag = iStack_40, thisArg.u.ptr = local_48.ptr,
           iVar2 = JS_FlattenIntoArray(ctx,JVar5,JVar4,sourceLen,0,depthNum,mapperFunction,thisArg),
           -1 < iVar2)) {
          JS_FreeValue(ctx,JVar4);
          return JVar5;
        }
        goto LAB_001559e2;
      }
    }
  }
  JVar5 = (JSValue)(ZEXT816(3) << 0x40);
  uVar3 = 0;
LAB_001559e2:
  JS_FreeValue(ctx,JVar4);
  JVar4.u.ptr = (void *)((ulong)JVar5.u.ptr & 0xffffffff | uVar3 << 0x20);
  JVar4.tag = JVar5.tag;
  JS_FreeValue(ctx,JVar4);
  return (JSValue)(ZEXT816(6) << 0x40);
}

Assistant:

static JSValue js_array_flatten(JSContext *ctx, JSValueConst this_val,
                                int argc, JSValueConst *argv, int map)
{
    JSValue obj, arr;
    JSValueConst mapperFunction, thisArg;
    int64_t sourceLen;
    int depthNum;

    arr = JS_UNDEFINED;
    obj = JS_ToObject(ctx, this_val);
    if (js_get_length64(ctx, &sourceLen, obj))
        goto exception;

    depthNum = 1;
    mapperFunction = JS_UNDEFINED;
    thisArg = JS_UNDEFINED;
    if (map) {
        mapperFunction = argv[0];
        if (argc > 1) {
            thisArg = argv[1];
        }
        if (check_function(ctx, mapperFunction))
            goto exception;
    } else {
        if (argc > 0 && !JS_IsUndefined(argv[0])) {
            if (JS_ToInt32Sat(ctx, &depthNum, argv[0]) < 0)
                goto exception;
        }
    }
    arr = JS_ArraySpeciesCreate(ctx, obj, JS_NewInt32(ctx, 0));
    if (JS_IsException(arr))
        goto exception;
    if (JS_FlattenIntoArray(ctx, arr, obj, sourceLen, 0, depthNum,
                            mapperFunction, thisArg) < 0)
        goto exception;
    JS_FreeValue(ctx, obj);
    return arr;

exception:
    JS_FreeValue(ctx, obj);
    JS_FreeValue(ctx, arr);
    return JS_EXCEPTION;
}